

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeNVT::FluctuatingChargeNVT(FluctuatingChargeNVT *this,SimInfo *info)

{
  FluctuatingChargePropagator::FluctuatingChargePropagator
            (&this->super_FluctuatingChargePropagator,info);
  (this->super_FluctuatingChargePropagator)._vptr_FluctuatingChargePropagator =
       (_func_int **)&PTR__FluctuatingChargeNVT_002fc360;
  (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->maxIterNum_ = 4;
  this->chiTolerance_ = 1e-06;
  this->snap = info->sman_->currentSnapshot_;
  (this->thermo).info_ = info;
  return;
}

Assistant:

FluctuatingChargeNVT::FluctuatingChargeNVT(SimInfo* info) :
      FluctuatingChargePropagator(info), maxIterNum_(4), chiTolerance_(1e-6),
      snap(info->getSnapshotManager()->getCurrentSnapshot()), thermo(info) {}